

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O3

void __thiscall
directed_flag_complex_cell_in_memory_t<std::pair<int,float>>::set_data<unsigned_short*>
          (directed_flag_complex_cell_in_memory_t<std::pair<int,float>> *this,int dimension,
          unsigned_short *vertices,pair<int,_float> _data,int offset)

{
  ushort uVar1;
  long lVar2;
  long lVar3;
  runtime_error *this_00;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  if (dimension != 0) {
    lVar3 = (long)offset;
    do {
      lVar2 = *(long *)(this + 0x10);
      if (lVar2 == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,"A cell could not be found in the directed flag complex.");
        goto LAB_0012dc9a;
      }
      lVar5 = *(long *)(lVar2 + 0x10);
      if (lVar5 == 0) {
LAB_0012dc60:
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,"A cell could not be found in the directed flag complex.");
LAB_0012dc9a:
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar3 = lVar3 + 1;
      uVar1 = vertices[lVar3];
      lVar4 = lVar2 + 8;
      do {
        bVar6 = *(ushort *)(lVar5 + 0x20) < uVar1;
        if (!bVar6) {
          lVar4 = lVar5;
        }
        lVar5 = *(long *)(lVar5 + 0x10 + (ulong)bVar6 * 8);
      } while (lVar5 != 0);
      if ((lVar4 == lVar2 + 8) || (uVar1 < *(ushort *)(lVar4 + 0x20))) goto LAB_0012dc60;
      this = (directed_flag_complex_cell_in_memory_t<std::pair<int,float>> *)(lVar4 + 0x28);
      dimension = dimension + -1;
    } while (dimension != 0);
  }
  *(pair<int,_float> *)(this + 4) = _data;
  return;
}

Assistant:

void set_data(int dimension, const Cell vertices, ExtraData _data, int offset = 0) {
		if (dimension == 0) {
			data = _data;
			return;
		}

		if (children == nullptr) {
			throw std::runtime_error("A cell could not be found in the directed flag complex.");
		}

		offset++;
		auto pair = children->find(vertices[offset]);
		if (pair == children->end()) {
			throw std::runtime_error("A cell could not be found in the directed flag complex.");
		}

		pair->second.set_data(dimension - 1, vertices, _data, offset);
	}